

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O0

void __thiscall
wasm::PossibleConstantValues::note(PossibleConstantValues *this,Expression *expr,Module *wasm)

{
  bool bVar1;
  GlobalGet *pGVar2;
  Global *pGVar3;
  Global *global;
  GlobalGet *get;
  Literal local_38;
  Module *local_20;
  Module *wasm_local;
  Expression *expr_local;
  PossibleConstantValues *this_local;
  
  local_20 = wasm;
  wasm_local = (Module *)expr;
  expr_local = (Expression *)this;
  bVar1 = Properties::isConstantExpression(expr);
  if (bVar1) {
    Properties::getLiteral(&local_38,(Expression *)wasm_local);
    note<wasm::Literal>(this,&local_38);
    wasm::Literal::~Literal(&local_38);
  }
  else {
    pGVar2 = Expression::dynCast<wasm::GlobalGet>((Expression *)wasm_local);
    if ((pGVar2 == (GlobalGet *)0x0) ||
       (pGVar3 = Module::getGlobal(local_20,(Name)(pGVar2->name).super_IString.str),
       (pGVar3->mutable_ & 1U) != 0)) {
      noteUnknown(this);
    }
    else {
      note<wasm::Name>(this,(Name)(pGVar2->name).super_IString.str);
    }
  }
  return;
}

Assistant:

void note(Expression* expr, Module& wasm) {
    // If this is a constant literal value, note that.
    if (Properties::isConstantExpression(expr)) {
      note(Properties::getLiteral(expr));
      return;
    }

    // If this is an immutable global that we get, note that.
    if (auto* get = expr->dynCast<GlobalGet>()) {
      auto* global = wasm.getGlobal(get->name);
      if (global->mutable_ == Immutable) {
        note(get->name);
        return;
      }
    }

    // Otherwise, this is not something we can reason about.
    noteUnknown();
  }